

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

bool __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>::HasAnyFixedProperties
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true> *this)

{
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *pBVar1;
  int iVar2;
  int iVar3;
  SimpleDictionaryPropertyDescriptor<int> *pSVar4;
  bool bVar5;
  
  pBVar1 = (this->propertyMap).ptr;
  iVar2 = pBVar1->count - pBVar1->freeCount;
  bVar5 = 0 < iVar2;
  if ((0 < iVar2) &&
     (pSVar4 = JsUtil::
               BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
               ::GetValueAt(pBVar1,0), ((ulong)*pSVar4 & 4) == 0)) {
    iVar2 = 1;
    do {
      pBVar1 = (this->propertyMap).ptr;
      iVar3 = pBVar1->count - pBVar1->freeCount;
      bVar5 = iVar2 < iVar3;
      if (iVar3 <= iVar2) {
        return bVar5;
      }
      pSVar4 = JsUtil::
               BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
               ::GetValueAt(pBVar1,iVar2);
      iVar2 = iVar2 + 1;
    } while (((ulong)*pSVar4 & 4) == 0);
  }
  return bVar5;
}

Assistant:

bool SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::HasAnyFixedProperties() const
    {
        for (int i = 0; i < propertyMap->Count(); i++)
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor = propertyMap->GetValueAt(i);
            if (descriptor.isFixed)
            {
                return true;
            }
        }
        return false;
    }